

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pospopcnt.c
# Opt level: O2

void pospopcnt_u8_sse_horizreduce(uint8_t *data,size_t len,uint32_t *flag_counts)

{
  undefined1 (*pauVar1) [16];
  undefined1 (*pauVar2) [16];
  ulong uVar3;
  uint8_t *data_00;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [32];
  undefined8 uVar13;
  undefined1 auVar14 [32];
  undefined1 auVar15 [64];
  undefined1 auVar16 [64];
  undefined1 auVar17 [64];
  undefined1 auVar18 [64];
  undefined1 auVar19 [16];
  undefined1 auVar20 [64];
  undefined1 auVar21 [16];
  undefined1 auVar22 [32];
  undefined1 auVar23 [16];
  undefined1 auVar24 [32];
  undefined1 auVar25 [16];
  undefined1 auVar26 [64];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [64];
  undefined1 auVar31 [16];
  undefined1 auVar32 [64];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  
  auVar21._8_4_ = 0x55555555;
  auVar21._0_8_ = 0x5555555555555555;
  auVar21._12_4_ = 0x55555555;
  auVar23._8_4_ = 0x33333333;
  auVar23._0_8_ = 0x3333333333333333;
  auVar23._12_4_ = 0x33333333;
  auVar27[8] = 7;
  auVar27._0_8_ = 0x707070707070707;
  auVar27[9] = 7;
  auVar27[10] = 7;
  auVar27[0xb] = 7;
  auVar27[0xc] = 7;
  auVar27[0xd] = 7;
  auVar27[0xe] = 7;
  auVar27[0xf] = 7;
  auVar28[8] = 0x70;
  auVar28._0_8_ = 0x7070707070707070;
  auVar28[9] = 0x70;
  auVar28[10] = 0x70;
  auVar28[0xb] = 0x70;
  auVar28[0xc] = 0x70;
  auVar28[0xd] = 0x70;
  auVar28[0xe] = 0x70;
  auVar28[0xf] = 0x70;
  uVar3 = len & 0xffffffffffffffc0;
  auVar20 = ZEXT1664((undefined1  [16])0x0);
  auVar15 = ZEXT1664((undefined1  [16])0x0);
  auVar26 = ZEXT1664((undefined1  [16])0x0);
  auVar16 = ZEXT1664((undefined1  [16])0x0);
  auVar30 = ZEXT1664((undefined1  [16])0x0);
  auVar17 = ZEXT1664((undefined1  [16])0x0);
  auVar32 = ZEXT1664((undefined1  [16])0x0);
  auVar18 = ZEXT1664((undefined1  [16])0x0);
  data_00 = data + uVar3;
  while( true ) {
    auVar10 = auVar16._0_16_;
    auVar29 = auVar30._0_16_;
    auVar31 = auVar32._0_16_;
    auVar11 = auVar15._0_16_;
    auVar19 = auVar20._0_16_;
    auVar25 = auVar26._0_16_;
    auVar9 = auVar17._0_16_;
    auVar8 = auVar18._0_16_;
    if (uVar3 == 0) break;
    auVar33 = *(undefined1 (*) [16])data;
    pauVar1 = (undefined1 (*) [16])((long)data + 0x10);
    pauVar2 = (undefined1 (*) [16])((long)data + 0x20);
    auVar4 = vmovdqu64_avx512vl(*(undefined1 (*) [16])((long)data + 0x30));
    data = (uint8_t *)((long)data + 0x40);
    uVar3 = uVar3 - 0x40;
    auVar5 = vpandd_avx512vl(auVar33,auVar21);
    auVar6 = vpandd_avx512vl(*pauVar1,auVar21);
    auVar33 = vpsrld_avx(auVar33,1);
    auVar34 = vpsrld_avx(*pauVar1,1);
    auVar33 = vpand_avx(auVar33,auVar21);
    auVar34 = vpand_avx(auVar34,auVar21);
    auVar5 = vpaddd_avx512vl(auVar6,auVar5);
    auVar6 = vpandd_avx512vl(auVar4,auVar21);
    auVar4 = vpsrld_avx512vl(auVar4,1);
    auVar33 = vpaddd_avx(auVar34,auVar33);
    auVar34 = vpand_avx(*pauVar2,auVar21);
    auVar36 = vpsrld_avx(*pauVar2,1);
    auVar4 = vpandd_avx512vl(auVar4,auVar21);
    auVar6 = vpaddd_avx512vl(auVar6,auVar34);
    auVar34 = vpand_avx(auVar36,auVar21);
    auVar34 = vpaddd_avx512vl(auVar4,auVar34);
    auVar4 = vpandd_avx512vl(auVar5,auVar23);
    auVar36 = vpandd_avx512vl(auVar6,auVar23);
    auVar5 = vpsrld_avx512vl(auVar5,2);
    auVar35 = vpsrld_avx(auVar6,2);
    auVar6 = vpaddd_avx512vl(auVar36,auVar4);
    auVar36 = vpandd_avx512vl(auVar33,auVar23);
    auVar7 = vpandd_avx512vl(auVar34,auVar23);
    auVar4 = vpsrld_avx(auVar33,2);
    auVar37 = vpsrld_avx(auVar34,2);
    auVar5 = vpandd_avx512vl(auVar5,auVar23);
    auVar33 = vpand_avx(auVar35,auVar23);
    auVar34 = vpand_avx(auVar4,auVar23);
    auVar4 = vpand_avx(auVar37,auVar23);
    auVar36 = vpaddd_avx512vl(auVar7,auVar36);
    auVar5 = vpaddd_avx512vl(auVar33,auVar5);
    auVar33 = vpaddd_avx(auVar4,auVar34);
    auVar4 = vpandq_avx512vl(auVar6,auVar27);
    auVar7 = vpandq_avx512vl(auVar36,auVar27);
    auVar35 = vpandq_avx512vl(auVar5,auVar27);
    auVar6 = vpandq_avx512vl(auVar6,auVar28);
    auVar36 = vpandq_avx512vl(auVar36,auVar28);
    auVar34 = vpand_avx(auVar5,auVar28);
    auVar37 = vpandq_avx512vl(auVar33,auVar27);
    auVar33 = vpand_avx(auVar33,auVar28);
    auVar4 = vpsadbw_avx(auVar4,(undefined1  [16])0x0);
    auVar5 = vpsadbw_avx512vl(auVar6,(undefined1  [16])0x0);
    auVar6 = vpsadbw_avx512vl(auVar7,(undefined1  [16])0x0);
    auVar36 = vpsadbw_avx512vl(auVar36,(undefined1  [16])0x0);
    auVar7 = vpsadbw_avx512vl(auVar35,(undefined1  [16])0x0);
    auVar34 = vpsadbw_avx(auVar34,(undefined1  [16])0x0);
    auVar35 = vpsadbw_avx512vl(auVar37,(undefined1  [16])0x0);
    auVar33 = vpsadbw_avx(auVar33,(undefined1  [16])0x0);
    auVar8 = vpaddq_avx(auVar4,auVar8);
    auVar18 = ZEXT1664(auVar8);
    auVar8 = vpaddq_avx512vl(auVar5,auVar31);
    auVar32 = ZEXT1664(auVar8);
    auVar9 = vpaddq_avx512vl(auVar6,auVar9);
    auVar17 = ZEXT1664(auVar9);
    auVar9 = vpaddq_avx512vl(auVar36,auVar29);
    auVar30 = ZEXT1664(auVar9);
    auVar10 = vpaddq_avx512vl(auVar7,auVar10);
    auVar16 = ZEXT1664(auVar10);
    auVar10 = vpaddq_avx(auVar34,auVar25);
    auVar26 = ZEXT1664(auVar10);
    auVar11 = vpaddq_avx512vl(auVar35,auVar11);
    auVar15 = ZEXT1664(auVar11);
    auVar11 = vpaddq_avx(auVar33,auVar19);
    auVar20 = ZEXT1664(auVar11);
  }
  auVar23 = vpunpcklqdq_avx(auVar31,auVar29);
  auVar21 = vpunpckhqdq_avx(auVar31,auVar29);
  uVar13 = auVar15._0_8_;
  auVar24._8_8_ = uVar13;
  auVar24._0_8_ = uVar13;
  auVar24._16_8_ = uVar13;
  auVar24._24_8_ = uVar13;
  auVar21 = vpaddq_avx(auVar23,auVar21);
  auVar27 = vpunpcklqdq_avx(auVar25,auVar19);
  auVar23 = vpunpckhqdq_avx(auVar25,auVar19);
  auVar23 = vpaddq_avx(auVar27,auVar23);
  auVar28 = vpunpcklqdq_avx(auVar8,auVar9);
  auVar27 = vpunpckhqdq_avx(auVar8,auVar9);
  auVar17 = vinserti32x4_avx512f(auVar15,auVar21,2);
  auVar14._0_16_ = ZEXT116(0) * auVar11 + ZEXT116(1) * auVar11;
  auVar14._16_16_ = ZEXT116(0) * auVar15._16_16_ + ZEXT116(1) * auVar11;
  auVar22._0_16_ = ZEXT116(0) * auVar10 + ZEXT116(1) * auVar28;
  auVar22._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar10;
  auVar12 = vpermq_avx2(auVar16._0_32_,0x55);
  auVar15 = vinserti32x4_avx512f(auVar17,auVar23,3);
  auVar12 = vpblendd_avx2(ZEXT1632(auVar27),auVar12,0xf0);
  auVar22 = vpblendd_avx2(auVar22,auVar24,0xc0);
  auVar12 = vpblendd_avx2(auVar12,auVar14,0xc0);
  auVar15 = vpsrlq_avx512f(auVar15,4);
  auVar12 = vpaddq_avx2(auVar22,auVar12);
  auVar15 = vinserti64x4_avx512f(auVar15,auVar12,0);
  auVar12 = vpmovqd_avx512f(auVar15);
  auVar12 = vpaddd_avx2(auVar12,*(undefined1 (*) [32])flag_counts);
  *(undefined1 (*) [32])flag_counts = auVar12;
  pospopcnt_u8_scalar_naive(data_00,(ulong)((uint)len & 0x3f),flag_counts);
  return;
}

Assistant:

void pospopcnt_u8_sse_horizreduce(const uint8_t* data, size_t len, uint32_t* flag_counts) {
    const __m128i zero = _mm_setzero_si128();

    __m128i counter_a = zero;
    __m128i counter_b = zero;
    __m128i counter_c = zero;
    __m128i counter_d = zero;
    __m128i counter_e = zero;
    __m128i counter_f = zero;
    __m128i counter_g = zero;
    __m128i counter_h = zero;

    for (const uint8_t* end = &data[(len & ~63)]; data != end; data += 64) {
        // r0 = [a0|b0|c0|d0|e0|f0|g0|h0]
        // r1 = [a1|b1|c1|d1|e1|f1|g1|h1]
        // r2 = [a2|b2|c2|d2|e2|f2|g2|h2]
        // r3 = [a3|b3|c3|d3|e3|f3|g3|h3]
        const __m128i r0 = _mm_loadu_si128((__m128i*)&data[0*16]);
        const __m128i r1 = _mm_loadu_si128((__m128i*)&data[1*16]);
        const __m128i r2 = _mm_loadu_si128((__m128i*)&data[2*16]);
        const __m128i r3 = _mm_loadu_si128((__m128i*)&data[3*16]);

        // s0 = [a0+a1|c0+c1|e0+e1|g0+g1]
        // s1 = [b0+b1|d0+d1|f0+f1|h0+h1]
        // s2 = [a2+a3|c2+c3|e2+e3|g2+g3]
        // s3 = [b2+b3|d2+d3|f2+f3|h2+h3]
        const __m128i s0 = sse4_add1_even(r0, r1);
        const __m128i s1 = sse4_add1_odd (r0, r1);
        const __m128i s2 = sse4_add1_even(r2, r3);
        const __m128i s3 = sse4_add1_odd (r2, r3);

        // d0 = [a0+a1+a2+a3|e0+e1+e2+e3]
        // d1 = [b0+b1+b2+b3|f0+f1+f2+f3]
        // d2 = [c0+c1+c2+c3|g0+g1+g2+g3]
        // d3 = [d0+d1+d2+d3|h0+h1+h2+h3]
        const __m128i d0 = sse4_add2_even(s0, s2);
        const __m128i d1 = sse4_add2_even(s1, s3);
        const __m128i d2 = sse4_add2_odd (s0, s2);
        const __m128i d3 = sse4_add2_odd (s1, s3);

        // popcnt for 4-bit subwords in each registers
        const __m128i mask_lo = _mm_set1_epi8(0x0f);
        const __m128i mask_hi = _mm_set1_epi8(0xf0);
        // Note: counter for higher nibble have to be divided by 16
        const __m128i sum0 = _mm_sad_epu8(d0 & mask_lo, zero);
        const __m128i sum1 = _mm_sad_epu8(d0 & mask_hi, zero);
        const __m128i sum2 = _mm_sad_epu8(d1 & mask_lo, zero);
        const __m128i sum3 = _mm_sad_epu8(d1 & mask_hi, zero);
        const __m128i sum4 = _mm_sad_epu8(d2 & mask_lo, zero);
        const __m128i sum5 = _mm_sad_epu8(d2 & mask_hi, zero);
        const __m128i sum6 = _mm_sad_epu8(d3 & mask_lo, zero);
        const __m128i sum7 = _mm_sad_epu8(d3 & mask_hi, zero);

        counter_a = _mm_add_epi64(counter_a, sum0);
        counter_b = _mm_add_epi64(counter_b, sum1);
        counter_c = _mm_add_epi64(counter_c, sum2);
        counter_d = _mm_add_epi64(counter_d, sum3);
        counter_e = _mm_add_epi64(counter_e, sum4);
        counter_f = _mm_add_epi64(counter_f, sum5);
        counter_g = _mm_add_epi64(counter_g, sum6);
        counter_h = _mm_add_epi64(counter_h, sum7);
    }

    flag_counts[0] += sse4_sum_epu64(counter_a);
    flag_counts[1] += sse4_sum_epu64(counter_c);
    flag_counts[2] += sse4_sum_epu64(counter_e);
    flag_counts[3] += sse4_sum_epu64(counter_g);
    flag_counts[4] += sse4_sum_epu64(counter_b) >> 4;
    flag_counts[5] += sse4_sum_epu64(counter_d) >> 4;
    flag_counts[6] += sse4_sum_epu64(counter_f) >> 4;
    flag_counts[7] += sse4_sum_epu64(counter_h) >> 4;

    // scalar tail loop
    pospopcnt_u8_scalar_naive(data, len % 64, flag_counts);
}